

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_>::Data
          (Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *this,
          Data<QHashPrivate::MultiNode<QByteArray,_QByteArray>_> *other,size_t reserved)

{
  byte bVar1;
  ulong uVar2;
  Span *pSVar3;
  Entry *pEVar4;
  MultiNode<QByteArray,_QByteArray> *this_00;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  long lVar8;
  QByteArrayView QVar9;
  R RVar10;
  Bucket BVar11;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  uVar2 = other->size;
  this->size = uVar2;
  if (reserved < uVar2) {
    reserved = uVar2;
  }
  this->seed = other->seed;
  this->spans = (Span *)0x0;
  sVar7 = 0x80;
  if ((0x40 < reserved) && (sVar7 = 0xffffffffffffffff, reserved >> 0x3e == 0)) {
    lVar5 = 0x3f;
    if (reserved != 0) {
      for (; reserved >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    sVar7 = 1L << (0x41 - ((byte)lVar5 ^ 0x3f) & 0x3f);
  }
  this->numBuckets = sVar7;
  RVar10 = allocateSpans(sVar7);
  this->spans = (Span *)RVar10.spans;
  uVar2 = other->numBuckets;
  if (0x7f < uVar2) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      pSVar3 = other->spans;
      lVar8 = 0;
      do {
        bVar1 = pSVar3->offsets[lVar8 + lVar5];
        if (bVar1 != 0xff) {
          pEVar4 = pSVar3[uVar6].entries;
          QVar9.m_data = *(storage_type **)(pEVar4[bVar1].storage.data + 8);
          QVar9.m_size = *(qsizetype *)(pEVar4[bVar1].storage.data + 0x10);
          sVar7 = qHash(QVar9,this->seed);
          BVar11 = findBucketWithHash<QByteArray>(this,(QByteArray *)(pEVar4 + bVar1),sVar7);
          this_00 = Span<QHashPrivate::MultiNode<QByteArray,_QByteArray>_>::insert
                              (BVar11.span,BVar11.index);
          MultiNode<QByteArray,_QByteArray>::MultiNode
                    (this_00,(MultiNode<QByteArray,_QByteArray> *)(pEVar4 + bVar1));
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x80);
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x90;
    } while (uVar6 != uVar2 >> 7);
  }
  return;
}

Assistant:

Data(const Data &other, size_t reserved) : size(other.size), seed(other.seed)
    {
        numBuckets = GrowthPolicy::bucketsForCapacity(qMax(size, reserved));
        spans = allocateSpans(numBuckets).spans;
        size_t otherNSpans = other.numBuckets >> SpanConstants::SpanShift;
        reallocationHelper<true>(other, otherNSpans);
    }